

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O3

void __thiscall ON_DimStyle::SetMaskColor(ON_DimStyle *this,ON_Color color)

{
  ON_TextMask text_mask;
  ON_TextMask local_38;
  
  local_38.m_content_hash.m_digest._12_8_ =
       *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 0xc);
  local_38.m_bDrawMask = (this->m_text_mask).m_bDrawMask;
  local_38.m_mask_type = (this->m_text_mask).m_mask_type;
  local_38.m_mask_frame = (this->m_text_mask).m_mask_frame;
  local_38.m_reserved2 = (this->m_text_mask).m_reserved2;
  local_38.m_mask_color.field_0 = (this->m_text_mask).m_mask_color.field_0;
  local_38.m_mask_border = (this->m_text_mask).m_mask_border;
  local_38.m_reserved3 = (this->m_text_mask).m_reserved3;
  local_38.m_content_hash.m_digest[0] = (this->m_text_mask).m_content_hash.m_digest[0];
  local_38.m_content_hash.m_digest[1] = (this->m_text_mask).m_content_hash.m_digest[1];
  local_38.m_content_hash.m_digest[2] = (this->m_text_mask).m_content_hash.m_digest[2];
  local_38.m_content_hash.m_digest[3] = (this->m_text_mask).m_content_hash.m_digest[3];
  local_38.m_content_hash.m_digest._4_8_ =
       *(undefined8 *)((this->m_text_mask).m_content_hash.m_digest + 4);
  ON_TextMask::SetMaskColor(&local_38,color);
  Internal_SetTextMask(this,&local_38);
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,MaskColor);
  return;
}

Assistant:

void ON_DimStyle::SetMaskColor(ON_Color color)
{
  // This function is for legacy compatibility.
  // In October 2016, text mask information was moved from
  // a collection of individual values on ON_DimStyle to
  // an ON_TextMask class and a single ON_TextMask m_text_mask member
  // on ON_DimStyle.
  ON_TextMask text_mask = TextMask();
  text_mask.SetMaskColor(color);
  Internal_SetTextMask(text_mask);
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::MaskColor);
}